

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean_array_2_d.cxx
# Opt level: O0

void __thiscall BooleanArray2D::BooleanArray2D(BooleanArray2D *this,uint rows,uint cols)

{
  logic_error *plVar1;
  uchar *puVar2;
  double dVar3;
  uint size;
  uint cols_local;
  uint rows_local;
  BooleanArray2D *this_local;
  
  this->rows = rows;
  this->cols = cols;
  if (rows == 0) {
    plVar1 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar1,"Rows must be bigger than 0.");
    __cxa_throw(plVar1,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if (cols == 0) {
    plVar1 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(plVar1,"Columns must be bigger than 0.");
    __cxa_throw(plVar1,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  dVar3 = ceil((double)(rows * cols) * 0.125);
  puVar2 = (uchar *)operator_new__((ulong)(uint)((int)(long)dVar3 << 3));
  this->data = puVar2;
  return;
}

Assistant:

BooleanArray2D::BooleanArray2D(unsigned int rows, unsigned int cols)
    : rows(rows), cols(cols)
{
    if(rows == 0) {
        throw std::logic_error("Rows must be bigger than 0.");
    }
    if(cols == 0) {
        throw std::logic_error("Columns must be bigger than 0.");
    }

    unsigned int size = 8 * (unsigned int) ceil((float) (rows * cols) / 8.0);
    data = new unsigned char[size];
}